

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

db_bit * __thiscall lan::db::read_value_bit(db *this,string *content,bool in_array)

{
  char cVar1;
  int iVar2;
  long lVar3;
  db_bit *pdVar4;
  logic_error *this_00;
  undefined8 *puVar5;
  size_type *psVar6;
  undefined7 in_register_00000011;
  char *this_01;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  string name;
  undefined1 local_d0 [32];
  string local_b0;
  string local_90 [8];
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  local_88 = 0;
  local_80 = 0;
  this_01 = (char *)content;
  local_90 = (string  [8])&local_80;
  if ((int)CONCAT71(in_register_00000011,in_array) == 0) {
    pop_next((string *)local_d0,(db *)content,content);
    this_01 = local_d0;
    lVar3 = std::__cxx11::string::operator=(local_90,(string *)this_01);
    if (*(long *)(lVar3 + 8) == 0) {
      bVar9 = true;
    }
    else {
      pop_next(&local_b0,(db *)this_01,content);
      this_01 = "=";
      iVar2 = std::__cxx11::string::compare((char *)&local_b0);
      bVar9 = iVar2 != 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        this_01 = (char *)(local_b0.field_2._M_allocated_capacity + 1);
        operator_delete(local_b0._M_dataplus._M_p,(ulong)this_01);
      }
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      this_01 = (char *)(local_d0._16_8_ + 1);
      operator_delete((void *)local_d0._0_8_,(ulong)this_01);
    }
    if (bVar9) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_b0,"LANDB (pull_error): unable read value bit <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._0_8_ = *puVar5;
      psVar6 = puVar5 + 2;
      if ((size_type *)local_d0._0_8_ == psVar6) {
        local_d0._16_8_ = *psVar6;
        local_d0._24_8_ = puVar5[3];
        local_d0._0_8_ = local_d0 + 0x10;
      }
      else {
        local_d0._16_8_ = *psVar6;
      }
      local_d0._8_8_ = puVar5[1];
      *puVar5 = psVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)local_d0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  pop_next((string *)local_d0,(db *)this_01,content);
  cVar1 = *(char *)local_d0._0_8_;
  if (cVar1 == '\0') {
    bVar9 = false;
  }
  else {
    pop_next(&local_b0,(db *)this_01,content);
    iVar2 = std::__cxx11::string::compare((char *)&local_b0);
    bVar9 = iVar2 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (bVar9) {
    iVar2 = tolower((int)cVar1);
    lVar3 = 0;
    do {
      if ((char)iVar2 == (&db_bit_table)[lVar3]) {
        if (lVar3 != 9) goto LAB_001058c5;
        paVar8 = &local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_90,(undefined1 *)(local_88 + (long)local_90));
        pdVar4 = read_array_bit(this,&local_50,content);
        _Var7._M_p = local_50._M_dataplus._M_p;
        goto LAB_00105900;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xb);
    lVar3 = 8;
LAB_001058c5:
    paVar8 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_90,(undefined1 *)(local_88 + (long)local_90));
    pdVar4 = read_var_bit(this,&local_70,(db_bit_type)lVar3,content);
    _Var7._M_p = local_70._M_dataplus._M_p;
LAB_00105900:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p != paVar8) {
      operator_delete(_Var7._M_p,paVar8->_M_allocated_capacity + 1);
    }
  }
  else {
    pdVar4 = (db_bit *)0x0;
  }
  if (local_90 != (string  [8])&local_80) {
    operator_delete((void *)local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return pdVar4;
}

Assistant:

lan::db_bit * db::read_value_bit(std::string & content, bool in_array){
            std::string name;
            char c_type;
            db_bit_type type = Unsafe;
            lan::db_bit * bit = nullptr;
            if(!in_array and !((name = pop_next(content)).length() and (pop_next(content) == "="))){
                throw lan::errors::pull_error ("LANDB (pull_error): unable read value bit <" + bit->key + ">, invalid sintax.");
            } if( (c_type = pop_next(content)[0]) and (pop_next(content) == ":")){
                type = convert_to_bit_type(c_type);
                switch(type){
                    case Array: bit = read_array_bit(name, content); break;
                    default: bit = read_var_bit(name, type, content); break;
                } 
            } return bit;
        }